

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O1

PKCS12 * PKCS12_create(char *pass,char *name,EVP_PKEY *pkey,X509 *cert,stack_st_X509 *ca,int nid_key
                      ,int nid_cert,int iter,int mac_iter,int keytype)

{
  int iVar1;
  size_t sVar2;
  EVP_MD *pEVar3;
  EVP_CIPHER *pbe_cipher;
  size_t name_len;
  undefined4 extraout_var;
  uint8_t *d;
  uchar *puVar4;
  PKCS12 *out_data;
  uint iterations;
  uint uVar5;
  uint uVar6;
  X509 *pXVar7;
  uint32_t iterations_00;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  uint key_id_len;
  X509 *local_300;
  char *local_2f8;
  uint local_2ec;
  size_t local_2e8;
  char *local_2e0;
  uint8_t mac_key [64];
  CBB bag;
  CBB data;
  CBB bag_contents;
  CBB content_infos;
  CBB safe_contents;
  CBB wrapper;
  CBB auth_safe_data;
  CBB pfx;
  CBB cbb;
  uint8_t key_id [64];
  CBB auth_safe;
  CBB auth_safe_wrapper;
  
  uVar6 = 0x92;
  if (nid_key != 0) {
    uVar6 = nid_key;
  }
  uVar5 = 0x95;
  if (nid_cert != 0) {
    uVar5 = nid_cert;
  }
  iterations_00 = 0x800;
  if (iter != 0) {
    iterations_00 = iter;
  }
  iterations = mac_iter + (uint)(mac_iter == 0);
  if (((int)iterations < 0 || keytype != 0) ||
     ((local_300 = cert, local_2ec = uVar5, local_2e0 = pass,
      pkey == (EVP_PKEY *)0x0 && cert == (X509 *)0x0 &&
      (sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)ca), sVar2 == 0)))) {
    ERR_put_error(0x13,0,0x84,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                  ,0x444);
    return (PKCS12 *)0x0;
  }
  pXVar7 = local_300;
  local_2f8 = name;
  if (local_2e0 == (char *)0x0) {
    local_2e8 = 0;
  }
  else {
    local_2e8 = strlen(local_2e0);
  }
  key_id_len = 0;
  if (pkey != (EVP_PKEY *)0x0 && pXVar7 != (X509 *)0x0) {
    iVar1 = X509_check_private_key(pXVar7,pkey);
    if (iVar1 == 0) {
      return (PKCS12 *)0x0;
    }
    pEVar3 = EVP_sha1();
    iVar1 = X509_digest(pXVar7,pEVar3,key_id,&key_id_len);
    if (iVar1 == 0) {
      return (PKCS12 *)0x0;
    }
  }
  out_data = (PKCS12 *)0x0;
  iVar1 = CBB_init(&cbb,0);
  if (iVar1 == 0) goto LAB_00195a4c;
  iVar1 = CBB_add_asn1(&cbb,&pfx,0x20000010);
  if (((((iVar1 == 0) || (iVar1 = CBB_add_asn1_uint64(&pfx,3), iVar1 == 0)) ||
       (iVar1 = CBB_add_asn1(&pfx,&auth_safe,0x20000010), iVar1 == 0)) ||
      ((iVar1 = CBB_add_asn1_element(&auth_safe,6,kPKCS7Data,9), iVar1 == 0 ||
       (iVar1 = CBB_add_asn1(&auth_safe,&auth_safe_wrapper,0xa0000000), iVar1 == 0)))) ||
     ((iVar1 = CBB_add_asn1(&auth_safe_wrapper,&auth_safe_data,4), iVar1 == 0 ||
      (iVar1 = CBB_add_asn1(&auth_safe_data,&content_infos,0x20000010), pXVar7 = local_300,
      iVar1 == 0)))) goto LAB_00195a49;
  if ((local_300 == (X509 *)0x0) && (sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)ca), sVar2 == 0)) {
LAB_0019552a:
    if (pkey != (EVP_PKEY *)0x0) {
      iVar1 = CBB_add_asn1(&content_infos,(CBB *)mac_key,0x20000010);
      bVar9 = true;
      if ((((iVar1 != 0) &&
           (iVar1 = CBB_add_asn1_element((CBB *)mac_key,6,kPKCS7Data,9), iVar1 != 0)) &&
          (iVar1 = CBB_add_asn1((CBB *)mac_key,&wrapper,0xa0000000), iVar1 != 0)) &&
         (((iVar1 = CBB_add_asn1(&wrapper,&data,4), iVar1 != 0 &&
           (iVar1 = CBB_add_asn1(&data,&safe_contents,0x20000010), iVar1 != 0)) &&
          (iVar1 = CBB_add_asn1(&safe_contents,&bag,0x20000010), iVar1 != 0)))) {
        if ((int)uVar6 < 0) {
          iVar1 = CBB_add_asn1_element(&bag,6,kKeyBag,0xb);
          if ((iVar1 == 0) || (iVar1 = CBB_add_asn1(&bag,&bag_contents,0xa0000000), iVar1 == 0))
          goto LAB_00195869;
          iVar1 = EVP_marshal_private_key(&bag_contents,(EVP_PKEY *)pkey);
          bVar10 = iVar1 == 0;
        }
        else {
          local_300 = (X509 *)pkcs5_pbe2_nid_to_cipher(uVar6);
          bVar10 = false;
          bVar8 = local_300 != (X509 *)0x0;
          pXVar7 = (X509 *)(ulong)-(uint)bVar8;
          iVar1 = CBB_add_asn1_element(&bag,6,kPKCS8ShroudedKeyBag,0xb);
          bVar9 = true;
          if (iVar1 != 0) {
            iVar1 = CBB_add_asn1(&bag,&bag_contents,0xa0000000);
            if (iVar1 == 0) {
              bVar10 = false;
            }
            else {
              uVar6 = -(uint)bVar8 | uVar6;
              pXVar7 = (X509 *)(ulong)uVar6;
              iVar1 = PKCS8_marshal_encrypted_private_key
                                (&bag_contents,uVar6,(EVP_CIPHER *)local_300,local_2e0,local_2e8,
                                 (uint8_t *)0x0,0,iterations_00,(EVP_PKEY *)pkey);
              bVar9 = iVar1 == 0;
              bVar10 = !bVar9;
            }
          }
          bVar10 = !bVar10;
        }
        if (!bVar10) {
          if (local_2f8 == (char *)0x0) {
            name_len = 0;
          }
          else {
            name_len = strlen(local_2f8);
          }
          iVar1 = add_bag_attributes(&bag,local_2f8,name_len,key_id,(ulong)key_id_len);
          bVar9 = true;
          if (iVar1 != 0) {
            iVar1 = CBB_flush(&content_infos);
            bVar9 = iVar1 == 0;
          }
        }
      }
LAB_00195869:
      if (bVar9) goto LAB_00195a49;
      if (bVar9) {
        return (PKCS12 *)pXVar7;
      }
    }
    pEVar3 = EVP_sha1();
    iVar1 = CBB_flush(&auth_safe_data);
    if ((iVar1 != 0) && (iVar1 = RAND_bytes((uchar *)&bag,8), iVar1 != 0)) {
      iVar1 = EVP_MD_size(pEVar3);
      iVar1 = pkcs12_key_gen(local_2e0,local_2e8,(uint8_t *)&bag,8,'\x03',iterations,
                             CONCAT44(extraout_var,iVar1),mac_key,(EVP_MD *)pEVar3);
      if (iVar1 != 0) {
        iVar1 = EVP_MD_size(pEVar3);
        d = CBB_data(&auth_safe_data);
        sVar2 = CBB_len(&auth_safe_data);
        puVar4 = HMAC(pEVar3,mac_key,iVar1,d,sVar2,(uchar *)&wrapper,(uint *)&bag_contents);
        if (((((puVar4 != (uchar *)0x0) && (iVar1 = CBB_add_asn1(&pfx,&data,0x20000010), iVar1 != 0)
              ) && (iVar1 = CBB_add_asn1(&data,&safe_contents,0x20000010), iVar1 != 0)) &&
            ((iVar1 = EVP_marshal_digest_algorithm(&safe_contents,(EVP_MD *)pEVar3), iVar1 != 0 &&
             (iVar1 = CBB_add_asn1_octet_string
                                (&safe_contents,(uint8_t *)&wrapper,(ulong)(uint)bag_contents.child)
             , iVar1 != 0)))) &&
           ((iVar1 = CBB_add_asn1_octet_string(&data,(uint8_t *)&bag,8), iVar1 != 0 &&
            (iVar1 = CBB_add_asn1_uint64(&data,(ulong)iterations), iVar1 != 0)))) {
          out_data = (PKCS12 *)OPENSSL_malloc(0x10);
          if ((out_data != (PKCS12 *)0x0) &&
             (iVar1 = CBB_finish(&cbb,(uint8_t **)out_data,(size_t *)&out_data->mac), iVar1 != 0))
          goto LAB_00195a4c;
          OPENSSL_free(out_data);
        }
      }
    }
    out_data = (PKCS12 *)0x0;
  }
  else {
    if ((int)local_2ec < 0) {
      iVar1 = CBB_add_asn1(&content_infos,(CBB *)mac_key,0x20000010);
      if ((((iVar1 != 0) &&
           (iVar1 = CBB_add_asn1_element((CBB *)mac_key,6,kPKCS7Data,9), iVar1 != 0)) &&
          (iVar1 = CBB_add_asn1((CBB *)mac_key,&wrapper,0xa0000000), iVar1 != 0)) &&
         ((iVar1 = CBB_add_asn1(&wrapper,&data,4), iVar1 != 0 &&
          (iVar1 = add_cert_safe_contents
                             (&data,(X509 *)pXVar7,(stack_st_X509 *)ca,local_2f8,key_id,
                              (ulong)key_id_len), iVar1 != 0)))) {
        uVar5 = CBB_flush(&content_infos);
        goto joined_r0x00195799;
      }
    }
    else {
      pbe_cipher = pkcs5_pbe2_nid_to_cipher(local_2ec);
      iVar1 = CBB_init((CBB *)mac_key,0);
      if ((iVar1 == 0) ||
         (iVar1 = add_cert_safe_contents
                            ((CBB *)mac_key,(X509 *)local_300,(stack_st_X509 *)ca,local_2f8,key_id,
                             (ulong)key_id_len), iVar1 == 0)) {
        CBB_cleanup((CBB *)mac_key);
      }
      else {
        uVar5 = -(uint)(pbe_cipher != (EVP_CIPHER *)0x0) | local_2ec;
        local_300 = (X509 *)CBB_data((CBB *)mac_key);
        sVar2 = CBB_len((CBB *)mac_key);
        uVar5 = add_encrypted_data(&content_infos,uVar5,pbe_cipher,local_2e0,local_2e8,iterations_00
                                   ,(uint8_t *)local_300,sVar2);
        pXVar7 = (X509 *)(ulong)uVar5;
        CBB_cleanup((CBB *)mac_key);
joined_r0x00195799:
        if (uVar5 != 0) goto LAB_0019552a;
      }
    }
LAB_00195a49:
    out_data = (PKCS12 *)0x0;
  }
LAB_00195a4c:
  OPENSSL_cleanse(mac_key,0x40);
  CBB_cleanup(&cbb);
  return out_data;
}

Assistant:

PKCS12 *PKCS12_create(const char *password, const char *name,
                      const EVP_PKEY *pkey, X509 *cert,
                      const STACK_OF(X509) *chain, int key_nid, int cert_nid,
                      int iterations, int mac_iterations, int key_type) {
  // TODO(crbug.com/396434682): Improve these defaults.
  if (key_nid == 0) {
    key_nid = NID_pbe_WithSHA1And3_Key_TripleDES_CBC;
  }
  if (cert_nid == 0) {
    cert_nid = NID_pbe_WithSHA1And40BitRC2_CBC;
  }
  if (iterations == 0) {
    iterations = PKCS12_DEFAULT_ITER;
  }
  if (mac_iterations == 0) {
    mac_iterations = 1;
  }
  if (  // In OpenSSL, this specifies a non-standard Microsoft key usage
        // extension which we do not currently support.
      key_type != 0 ||
      // In OpenSSL, -1 here means to omit the MAC, which we do not
      // currently support. Omitting it is also invalid for a password-based
      // PKCS#12 file.
      mac_iterations < 0 ||
      // Don't encode empty objects.
      (pkey == NULL && cert == NULL && sk_X509_num(chain) == 0)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNSUPPORTED_OPTIONS);
    return 0;
  }

  // PKCS#12 is a very confusing recursive data format, built out of another
  // recursive data format. Section 5.1 of RFC 7292 describes the encoding
  // algorithm, but there is no clear overview. A quick summary:
  //
  // PKCS#7 defines a ContentInfo structure, which is a overgeneralized typed
  // combinator structure for applying cryptography. We care about two types. A
  // data ContentInfo contains an OCTET STRING and is a leaf node of the
  // combinator tree. An encrypted-data ContentInfo contains encryption
  // parameters (key derivation and encryption) and wraps another ContentInfo,
  // usually data.
  //
  // A PKCS#12 file is a PFX structure (section 4), which contains a single data
  // ContentInfo and a MAC over it. This root ContentInfo is the
  // AuthenticatedSafe and its payload is a SEQUENCE of other ContentInfos, so
  // that different parts of the PKCS#12 file can by differently protected.
  //
  // Each ContentInfo in the AuthenticatedSafe, after undoing all the PKCS#7
  // combinators, has SafeContents payload. A SafeContents is a SEQUENCE of
  // SafeBag. SafeBag is PKCS#12's typed structure, with subtypes such as KeyBag
  // and CertBag. Confusingly, there is a SafeContents bag type which itself
  // recursively contains more SafeBags, but we do not implement this. Bags also
  // can have attributes.
  //
  // The grouping of SafeBags into intermediate ContentInfos does not appear to
  // be significant, except that all SafeBags sharing a ContentInfo have the
  // same level of protection. Additionally, while keys may be encrypted by
  // placing a KeyBag in an encrypted-data ContentInfo, PKCS#12 also defines a
  // key-specific encryption container, PKCS8ShroudedKeyBag, which is used
  // instead.

  // Note that |password| may be NULL to specify no password, rather than the
  // empty string. They are encoded differently in PKCS#12. (One is the empty
  // byte array and the other is NUL-terminated UCS-2.)
  size_t password_len = password != NULL ? strlen(password) : 0;

  uint8_t key_id[EVP_MAX_MD_SIZE];
  unsigned key_id_len = 0;
  if (cert != NULL && pkey != NULL) {
    if (!X509_check_private_key(cert, pkey) ||
        // Matching OpenSSL, use the SHA-1 hash of the certificate as the local
        // key ID. Some PKCS#12 consumers require one to connect the private key
        // and certificate.
        !X509_digest(cert, EVP_sha1(), key_id, &key_id_len)) {
      return 0;
    }
  }

  // See https://tools.ietf.org/html/rfc7292#section-4.
  PKCS12 *ret = NULL;
  CBB cbb, pfx, auth_safe, auth_safe_wrapper, auth_safe_data, content_infos;
  uint8_t mac_key[EVP_MAX_MD_SIZE];
  if (!CBB_init(&cbb, 0) || !CBB_add_asn1(&cbb, &pfx, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_uint64(&pfx, 3) ||
      // auth_safe is a data ContentInfo.
      !CBB_add_asn1(&pfx, &auth_safe, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&auth_safe, CBS_ASN1_OBJECT, kPKCS7Data,
                            sizeof(kPKCS7Data)) ||
      !CBB_add_asn1(&auth_safe, &auth_safe_wrapper,
                    CBS_ASN1_CONSTRUCTED | CBS_ASN1_CONTEXT_SPECIFIC | 0) ||
      !CBB_add_asn1(&auth_safe_wrapper, &auth_safe_data,
                    CBS_ASN1_OCTETSTRING) ||
      // See https://tools.ietf.org/html/rfc7292#section-4.1. |auth_safe|'s
      // contains a SEQUENCE of ContentInfos.
      !CBB_add_asn1(&auth_safe_data, &content_infos, CBS_ASN1_SEQUENCE)) {
    goto err;
  }

  // If there are any certificates, place them in CertBags wrapped in a single
  // encrypted ContentInfo.
  if (cert != NULL || sk_X509_num(chain) > 0) {
    if (cert_nid < 0) {
      // Place the certificates in an unencrypted ContentInfo. This could be
      // more compactly-encoded by reusing the same ContentInfo as the key, but
      // OpenSSL does not do this. We keep them separate for consistency. (Keys,
      // even when encrypted, are always placed in unencrypted ContentInfos.
      // PKCS#12 defines bag-level encryption for keys.)
      CBB content_info, wrapper, data;
      if (!CBB_add_asn1(&content_infos, &content_info, CBS_ASN1_SEQUENCE) ||
          !CBB_add_asn1_element(&content_info, CBS_ASN1_OBJECT, kPKCS7Data,
                                sizeof(kPKCS7Data)) ||
          !CBB_add_asn1(&content_info, &wrapper,
                        CBS_ASN1_CONSTRUCTED | CBS_ASN1_CONTEXT_SPECIFIC | 0) ||
          !CBB_add_asn1(&wrapper, &data, CBS_ASN1_OCTETSTRING) ||
          !add_cert_safe_contents(&data, cert, chain, name, key_id,
                                  key_id_len) ||
          !CBB_flush(&content_infos)) {
        goto err;
      }
    } else {
      // This function differs from other OpenSSL functions in how PBES1 and
      // PBES2 schemes are selected. If the NID matches a cipher, treat this as
      // PBES2 instead. Convert to the other convention.
      const EVP_CIPHER *cipher = pkcs5_pbe2_nid_to_cipher(cert_nid);
      if (cipher != nullptr) {
        cert_nid = -1;
      }
      CBB plaintext_cbb;
      int ok =
          CBB_init(&plaintext_cbb, 0) &&
          add_cert_safe_contents(&plaintext_cbb, cert, chain, name, key_id,
                                 key_id_len) &&
          add_encrypted_data(&content_infos, cert_nid, cipher, password,
                             password_len, iterations, CBB_data(&plaintext_cbb),
                             CBB_len(&plaintext_cbb));
      CBB_cleanup(&plaintext_cbb);
      if (!ok) {
        goto err;
      }
    }
  }

  // If there is a key, place it in a single KeyBag or PKCS8ShroudedKeyBag
  // wrapped in an unencrypted ContentInfo. (One could also place it in a KeyBag
  // inside an encrypted ContentInfo, but OpenSSL does not do this and some
  // PKCS#12 consumers do not support KeyBags.)
  if (pkey != NULL) {
    CBB content_info, wrapper, data, safe_contents, bag, bag_contents;
    if (  // Add another data ContentInfo.
        !CBB_add_asn1(&content_infos, &content_info, CBS_ASN1_SEQUENCE) ||
        !CBB_add_asn1_element(&content_info, CBS_ASN1_OBJECT, kPKCS7Data,
                              sizeof(kPKCS7Data)) ||
        !CBB_add_asn1(&content_info, &wrapper,
                      CBS_ASN1_CONSTRUCTED | CBS_ASN1_CONTEXT_SPECIFIC | 0) ||
        !CBB_add_asn1(&wrapper, &data, CBS_ASN1_OCTETSTRING) ||
        !CBB_add_asn1(&data, &safe_contents, CBS_ASN1_SEQUENCE) ||
        // Add a SafeBag containing a PKCS8ShroudedKeyBag.
        !CBB_add_asn1(&safe_contents, &bag, CBS_ASN1_SEQUENCE)) {
      goto err;
    }
    if (key_nid < 0) {
      if (!CBB_add_asn1_element(&bag, CBS_ASN1_OBJECT, kKeyBag,
                                sizeof(kKeyBag)) ||
          !CBB_add_asn1(&bag, &bag_contents,
                        CBS_ASN1_CONSTRUCTED | CBS_ASN1_CONTEXT_SPECIFIC | 0) ||
          !EVP_marshal_private_key(&bag_contents, pkey)) {
        goto err;
      }
    } else {
      // This function differs from other OpenSSL functions in how PBES1 and
      // PBES2 schemes are selected. If the NID matches a cipher, treat this as
      // PBES2 instead. Convert to the other convention.
      const EVP_CIPHER *cipher = pkcs5_pbe2_nid_to_cipher(key_nid);
      if (cipher != nullptr) {
        key_nid = -1;
      }
      if (!CBB_add_asn1_element(&bag, CBS_ASN1_OBJECT, kPKCS8ShroudedKeyBag,
                                sizeof(kPKCS8ShroudedKeyBag)) ||
          !CBB_add_asn1(&bag, &bag_contents,
                        CBS_ASN1_CONSTRUCTED | CBS_ASN1_CONTEXT_SPECIFIC | 0) ||
          !PKCS8_marshal_encrypted_private_key(
              &bag_contents, key_nid, cipher, password, password_len,
              NULL /* generate a random salt */,
              0 /* use default salt length */, iterations, pkey)) {
        goto err;
      }
    }
    size_t name_len = 0;
    if (name) {
      name_len = strlen(name);
    }
    if (!add_bag_attributes(&bag, name, name_len, key_id, key_id_len) ||
        !CBB_flush(&content_infos)) {
      goto err;
    }
  }

  {
    // Compute the MAC. Match OpenSSL in using SHA-1 as the hash function. The
    // MAC covers |auth_safe_data|.
    const EVP_MD *mac_md = EVP_sha1();
    uint8_t mac_salt[PKCS5_SALT_LEN];
    uint8_t mac[EVP_MAX_MD_SIZE];
    unsigned mac_len;
    if (!CBB_flush(&auth_safe_data) ||
        !RAND_bytes(mac_salt, sizeof(mac_salt)) ||
        !pkcs12_key_gen(password, password_len, mac_salt, sizeof(mac_salt),
                        PKCS12_MAC_ID, mac_iterations, EVP_MD_size(mac_md),
                        mac_key, mac_md) ||
        !HMAC(mac_md, mac_key, EVP_MD_size(mac_md), CBB_data(&auth_safe_data),
              CBB_len(&auth_safe_data), mac, &mac_len)) {
      goto err;
    }

    CBB mac_data, digest_info;
    if (!CBB_add_asn1(&pfx, &mac_data, CBS_ASN1_SEQUENCE) ||
        !CBB_add_asn1(&mac_data, &digest_info, CBS_ASN1_SEQUENCE) ||
        // OpenSSL and NSS always include a NULL parameter with the digest
        // algorithm. Windows does not. RFC 7292 imports DigestInfo from PKCS
        // #7. PKCS #7 does not actually use DigestInfo. It just describes
        // RSASSA-PKCS1-v1_5 signing as encoding a DigestInfo and then
        // "encrypting" it with the private key. In that context, NULL should be
        // included. Confusingly, there is also a digestAlgorithm field in
        // SignerInfo. There, RFC 5754 says to omit the NULL. But that field
        // does not use DigestInfo per se.
        //
        // We match OpenSSL, NSS, and RSASSA-PKCS1-v1_5 in including the NULL.
        !EVP_marshal_digest_algorithm(&digest_info, mac_md) ||
        !CBB_add_asn1_octet_string(&digest_info, mac, mac_len) ||
        !CBB_add_asn1_octet_string(&mac_data, mac_salt, sizeof(mac_salt)) ||
        // The iteration count has a DEFAULT of 1, but RFC 7292 says "The
        // default is for historical reasons and its use is deprecated." Thus we
        // explicitly encode the iteration count, though it is not valid DER.
        !CBB_add_asn1_uint64(&mac_data, mac_iterations)) {
      goto err;
    }

    ret = reinterpret_cast<PKCS12 *>(OPENSSL_malloc(sizeof(PKCS12)));
    if (ret == NULL || !CBB_finish(&cbb, &ret->ber_bytes, &ret->ber_len)) {
      OPENSSL_free(ret);
      ret = NULL;
      goto err;
    }
  }

err:
  OPENSSL_cleanse(mac_key, sizeof(mac_key));
  CBB_cleanup(&cbb);
  return ret;
}